

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTAircraft.cpp
# Opt level: O3

void LTAircraft::CameraRegisterCommands(bool bRegister)

{
  int i;
  long lVar1;
  
  lVar1 = 0;
  do {
    if (dataRefs.cmdXP[lVar1] != (XPLMCommandRef)0x0) {
      if (bRegister) {
        XPLMRegisterCommandHandler();
      }
      else {
        XPLMUnregisterCommandHandler(dataRefs.cmdXP[lVar1],CameraCommandsCB,0,lVar1);
      }
    }
    lVar1 = lVar1 + 1;
  } while (lVar1 != 0x20);
  return;
}

Assistant:

void LTAircraft::CameraRegisterCommands(bool bRegister)
{
    // first time init?
    for (int i = CR_GENERAL_LEFT; i <= CR_GENERAL_ZOOM_OUT_FAST; i++) {
        if (dataRefs.cmdXP[i]) {
            if (bRegister)
                XPLMRegisterCommandHandler(dataRefs.cmdXP[i], CameraCommandsCB, 0, (void*)(long long)i);
            else
                XPLMUnregisterCommandHandler(dataRefs.cmdXP[i], CameraCommandsCB, 0, (void*)(long long)i);
        }
    }
}